

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_binary_text_gen.cpp
# Opt level: O1

void flatbuffers::anon_unknown_7::GenerateDocumentation
               (ostream *os,BinaryRegion *region,BinarySection *section,uint8_t *binary,
               DocContinuation *continuation,OutputConfig *output_config)

{
  string *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  BinaryRegionStatus BVar2;
  ulong uVar3;
  bool bVar4;
  size_type sVar5;
  char cVar6;
  ostream *poVar7;
  ostream *poVar8;
  undefined8 *puVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  char *pcVar12;
  ulong uVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  char cVar15;
  undefined8 uVar16;
  _Alloc_hider _Var17;
  OutputConfig *output_config_00;
  BinaryRegion *pBVar18;
  string value;
  stringstream ss;
  string local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_250;
  long local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  BinaryRegion *local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  ostream *local_208;
  ulong *local_200;
  uint local_1f8;
  undefined4 uStack_1f4;
  ulong local_1f0 [2];
  undefined1 local_1e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  long lStack_1c0;
  uint auStack_1b8 [22];
  ios_base local_160 [264];
  BinaryRegion *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (*(long *)binary != 0) {
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_1e0 + 0x10);
    local_1e0._0_8_ = paVar1;
    std::__cxx11::string::_M_construct((ulong)local_1e0,(char)*(long *)binary + -2);
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_1e0._0_8_,local_1e0._8_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._0_8_ != paVar1) {
      operator_delete((void *)local_1e0._0_8_,local_1d0._M_allocated_capacity + 1);
    }
    local_1e0[0] = (continuation->value).field_2._M_local_buf[8];
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(os,local_1e0,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    this = (string *)(binary + 8);
    std::__cxx11::string::substr((ulong)local_1e0,(ulong)this);
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_1e0._0_8_,local_1e0._8_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._0_8_ != paVar1) {
      operator_delete((void *)local_1e0._0_8_,local_1d0._M_allocated_capacity + 1);
    }
    std::__cxx11::string::substr((ulong)local_1e0,(ulong)this);
    std::__cxx11::string::operator=(this,(string *)local_1e0);
    uVar16 = local_1d0._M_allocated_capacity;
    _Var17._M_p = (pointer)local_1e0._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._0_8_ == paVar1) {
      return;
    }
    goto LAB_00324fa8;
  }
  output_config_00 = (OutputConfig *)continuation;
  local_230 = region;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1e0);
  pBVar18 = *(BinaryRegion **)(local_1d0._M_allocated_capacity - 0x18);
  *(long *)((long)&lStack_1c0 + (long)pBVar18) = (long)(int)continuation->value_start_column;
  *(uint *)((long)auStack_1b8 + *(long *)(local_1d0._M_allocated_capacity - 0x18)) =
       *(uint *)((long)auStack_1b8 + *(long *)(local_1d0._M_allocated_capacity - 0x18)) & 0xffffff4f
       | 0x20;
  (anonymous_namespace)::GenerateTypeString_abi_cxx11_
            (&local_270,(_anonymous_namespace_ *)local_230,pBVar18);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1e0 + 0x10),local_270._M_dataplus._M_p,local_270._M_string_length);
  paVar1 = &local_270.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != paVar1) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            (os,local_270._M_dataplus._M_p,local_270._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != paVar1) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  local_208 = os;
  std::__cxx11::stringbuf::str();
  sVar5 = local_270._M_string_length;
  local_58 = (BinaryRegion *)section;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != paVar1) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1e0);
  std::ios_base::~ios_base(local_160);
  poVar7 = local_208;
  std::__ostream_insert<char,std::char_traits<char>>(local_208," ",1);
  local_1e0[0] = (continuation->value).field_2._M_local_buf[8];
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_1e0,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
  if (local_230->array_length == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1e0);
    *(long *)((long)&lStack_1c0 + *(long *)(local_1d0._M_allocated_capacity - 0x18)) =
         (long)*(int *)&(continuation->value)._M_dataplus._M_p;
    *(uint *)((long)auStack_1b8 + *(long *)(local_1d0._M_allocated_capacity - 0x18)) =
         *(uint *)((long)auStack_1b8 + *(long *)(local_1d0._M_allocated_capacity - 0x18)) &
         0xffffff4f | 0x20;
    (anonymous_namespace)::ToValueString_abi_cxx11_
              (&local_270,(_anonymous_namespace_ *)local_230,local_58,(uint8_t *)continuation,
               output_config_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1e0 + 0x10),local_270._M_dataplus._M_p,local_270._M_string_length);
    poVar7 = local_208;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,local_270._M_dataplus._M_p,local_270._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1e0);
    std::ios_base::~ios_base(local_160);
  }
  else {
    *(size_type *)binary = sVar5 + 3;
    (anonymous_namespace)::ToValueString_abi_cxx11_
              (&local_270,(_anonymous_namespace_ *)local_230,local_58,(uint8_t *)continuation,
               output_config_00);
    std::__cxx11::stringstream::stringstream((stringstream *)local_1e0);
    *(long *)((long)&lStack_1c0 + *(long *)(local_1d0._M_allocated_capacity - 0x18)) =
         (long)*(int *)&(continuation->value)._M_dataplus._M_p;
    *(uint *)((long)auStack_1b8 + *(long *)(local_1d0._M_allocated_capacity - 0x18)) =
         *(uint *)((long)auStack_1b8 + *(long *)(local_1d0._M_allocated_capacity - 0x18)) &
         0xffffff4f | 0x20;
    std::__cxx11::string::substr((ulong)&local_250,(ulong)&local_270);
    poVar7 = local_208;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1e0 + 0x10),local_250->_M_local_buf,local_248);
    if (local_250 != &local_240) {
      operator_delete(local_250,local_240._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_250->_M_local_buf,local_248);
    if (local_250 != &local_240) {
      operator_delete(local_250,local_240._M_allocated_capacity + 1);
    }
    std::__cxx11::string::substr((ulong)&local_250,(ulong)&local_270);
    std::__cxx11::string::operator=((string *)(binary + 8),(string *)&local_250);
    if (local_250 != &local_240) {
      operator_delete(local_250,local_240._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1e0);
    std::ios_base::~ios_base(local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
  }
  paVar14 = &local_270.field_2;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
  local_1e0[0] = (continuation->value).field_2._M_local_buf[8];
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_1e0,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
  pBVar18 = local_230;
  paVar1 = &local_228.field_2;
  local_228._M_string_length = 0;
  local_228.field_2._M_local_buf[0] = '\0';
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_1e0 + 0x10);
  local_228._M_dataplus._M_p = (pointer)paVar1;
  switch((local_230->comment).type) {
  case Unknown:
    pcVar12 = "unknown";
    break;
  case SizePrefix:
    pcVar12 = "size prefix";
    break;
  case RootTableOffset:
    std::operator+(&local_270,"offset to root table `",&(local_230->comment).name);
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
    goto LAB_0032457a;
  case FileIdentifier:
    pcVar12 = "File Identifier";
    break;
  case Padding:
    pcVar12 = "padding";
    break;
  case VTableSize:
    pcVar12 = "size of this vtable";
    break;
  case VTableRefferingTableLength:
    pcVar12 = "size of referring table";
    break;
  case VTableFieldOffset:
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                   "offset to field `",&(local_230->comment).name);
    goto LAB_00324656;
  case VTableUnknownFieldOffset:
    uVar3 = (local_230->comment).index;
    cVar15 = '\x01';
    if (9 < uVar3) {
      uVar13 = uVar3;
      cVar6 = '\x04';
      do {
        cVar15 = cVar6;
        if (uVar13 < 100) {
          cVar15 = cVar15 + -2;
          goto LAB_003249d6;
        }
        if (uVar13 < 1000) {
          cVar15 = cVar15 + -1;
          goto LAB_003249d6;
        }
        if (uVar13 < 10000) goto LAB_003249d6;
        bVar4 = 99999 < uVar13;
        uVar13 = uVar13 / 10000;
        cVar6 = cVar15 + '\x04';
      } while (bVar4);
      cVar15 = cVar15 + '\x01';
    }
LAB_003249d6:
    local_250 = &local_240;
    std::__cxx11::string::_M_construct((ulong)&local_250,cVar15);
    std::__detail::__to_chars_10_impl<unsigned_long>(local_250->_M_local_buf,(uint)local_248,uVar3);
    puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,0x388eef);
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 == paVar10) {
      local_270.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_270.field_2._8_8_ = puVar9[3];
      local_270._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_270.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_270._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_270._M_string_length = puVar9[1];
    *puVar9 = paVar10;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
    goto LAB_00324bbe;
  case TableVTableOffset:
    pcVar12 = "offset to vtable";
    break;
  case TableField:
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                   "table field `",&(local_230->comment).name);
LAB_00324656:
    std::__cxx11::string::operator=((string *)&local_228,(string *)local_1e0);
    pBVar18 = local_230;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._0_8_ != paVar10) {
      operator_delete((void *)local_1e0._0_8_,local_1d0._M_allocated_capacity + 1);
      pBVar18 = local_230;
    }
    goto switchD_003242f7_default;
  case TableUnknownField:
    pcVar12 = "unknown field";
    break;
  case TableOffsetField:
    std::operator+(&local_270,"offset to field `",&(local_230->comment).name);
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
    goto LAB_0032457a;
  case StructField:
    std::operator+(&local_270,"struct field `",&(local_230->comment).name);
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
LAB_0032457a:
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 == paVar11) {
      local_1d0._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_1d0._8_8_ = puVar9[3];
      local_1e0._0_8_ = paVar10;
    }
    else {
      local_1d0._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_1e0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar9;
    }
    local_1e0._8_8_ = puVar9[1];
    *puVar9 = paVar11;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_228,(string *)local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._0_8_ != paVar10) {
      operator_delete((void *)local_1e0._0_8_,local_1d0._M_allocated_capacity + 1);
    }
    uVar16 = local_270.field_2._M_allocated_capacity;
    _Var17._M_p = local_270._M_dataplus._M_p;
    pBVar18 = local_230;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != paVar14) goto LAB_00324c61;
    goto switchD_003242f7_default;
  case ArrayField:
    std::operator+(&local_50,"array field `",&(local_230->comment).name);
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 == paVar10) {
      local_240._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_240._8_8_ = puVar9[3];
      local_250 = &local_240;
    }
    else {
      local_240._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_250 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar9;
    }
    local_248 = puVar9[1];
    *puVar9 = paVar10;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    uVar3 = (pBVar18->comment).index;
    cVar15 = '\x01';
    if (9 < uVar3) {
      uVar13 = uVar3;
      cVar6 = '\x04';
      do {
        cVar15 = cVar6;
        if (uVar13 < 100) {
          cVar15 = cVar15 + -2;
          goto LAB_00325117;
        }
        if (uVar13 < 1000) {
          cVar15 = cVar15 + -1;
          goto LAB_00325117;
        }
        if (uVar13 < 10000) goto LAB_00325117;
        bVar4 = 99999 < uVar13;
        uVar13 = uVar13 / 10000;
        cVar6 = cVar15 + '\x04';
      } while (bVar4);
      cVar15 = cVar15 + '\x01';
    }
LAB_00325117:
    local_200 = local_1f0;
    std::__cxx11::string::_M_construct((ulong)&local_200,cVar15);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_200,local_1f8,uVar3);
    uVar3 = CONCAT44(uStack_1f4,local_1f8) + local_248;
    uVar16 = 0xf;
    if (local_250 != &local_240) {
      uVar16 = local_240._M_allocated_capacity;
    }
    if ((ulong)uVar16 < uVar3) {
      uVar13 = 0xf;
      if (local_200 != local_1f0) {
        uVar13 = local_1f0[0];
      }
      if (uVar13 < uVar3) goto LAB_00325190;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_200,0,(char *)0x0,(ulong)local_250);
    }
    else {
LAB_00325190:
      puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_250,(ulong)local_200);
    }
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 == paVar10) {
      local_270.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_270.field_2._8_8_ = puVar9[3];
    }
    else {
      local_270.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_270._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_270._M_string_length = puVar9[1];
    *puVar9 = paVar10;
    puVar9[1] = 0;
    paVar10->_M_local_buf[0] = '\0';
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 == paVar10) {
      local_1d0._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_1d0._8_8_ = puVar9[3];
      local_1e0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_1e0 + 0x10);
    }
    else {
      local_1d0._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_1e0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar9;
    }
    local_1e0._8_8_ = puVar9[1];
    *puVar9 = paVar10;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_228,(string *)local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_1e0 + 0x10)) {
      operator_delete((void *)local_1e0._0_8_,local_1d0._M_allocated_capacity + 1);
    }
    pBVar18 = local_230;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    if (local_200 != local_1f0) {
      operator_delete(local_200,local_1f0[0] + 1);
    }
    if (local_250 != &local_240) {
      operator_delete(local_250,local_240._M_allocated_capacity + 1);
    }
    uVar16 = local_50.field_2._M_allocated_capacity;
    _Var17._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto switchD_003242f7_default;
    goto LAB_00324c61;
  case StringLength:
    pcVar12 = "length of string";
    break;
  case StringValue:
    pcVar12 = "string literal";
    break;
  case StringTerminator:
    pcVar12 = "string terminator";
    break;
  case VectorLength:
    pcVar12 = "length of vector (# items)";
    break;
  case VectorValue:
    uVar3 = (local_230->comment).index;
    cVar15 = '\x01';
    if (9 < uVar3) {
      uVar13 = uVar3;
      cVar6 = '\x04';
      do {
        cVar15 = cVar6;
        if (uVar13 < 100) {
          cVar15 = cVar15 + -2;
          goto LAB_00324b20;
        }
        if (uVar13 < 1000) {
          cVar15 = cVar15 + -1;
          goto LAB_00324b20;
        }
        if (uVar13 < 10000) goto LAB_00324b20;
        bVar4 = 99999 < uVar13;
        uVar13 = uVar13 / 10000;
        cVar6 = cVar15 + '\x04';
      } while (bVar4);
      cVar15 = cVar15 + '\x01';
    }
LAB_00324b20:
    local_250 = &local_240;
    std::__cxx11::string::_M_construct((ulong)&local_250,cVar15);
    std::__detail::__to_chars_10_impl<unsigned_long>(local_250->_M_local_buf,(uint)local_248,uVar3);
    puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,0x388fa7);
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 == paVar10) {
      local_270.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_270.field_2._8_8_ = puVar9[3];
      local_270._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_270.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_270._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_270._M_string_length = puVar9[1];
    *puVar9 = paVar10;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
    goto LAB_00324bbe;
  case VectorTableValue:
    uVar3 = (local_230->comment).index;
    cVar15 = '\x01';
    if (9 < uVar3) {
      uVar13 = uVar3;
      cVar6 = '\x04';
      do {
        cVar15 = cVar6;
        if (uVar13 < 100) {
          cVar15 = cVar15 + -2;
          goto LAB_0032488c;
        }
        if (uVar13 < 1000) {
          cVar15 = cVar15 + -1;
          goto LAB_0032488c;
        }
        if (uVar13 < 10000) goto LAB_0032488c;
        bVar4 = 99999 < uVar13;
        uVar13 = uVar13 / 10000;
        cVar6 = cVar15 + '\x04';
      } while (bVar4);
      cVar15 = cVar15 + '\x01';
    }
LAB_0032488c:
    local_250 = &local_240;
    std::__cxx11::string::_M_construct((ulong)&local_250,cVar15);
    std::__detail::__to_chars_10_impl<unsigned_long>(local_250->_M_local_buf,(uint)local_248,uVar3);
    puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,0x388fae);
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 == paVar10) {
      local_270.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_270.field_2._8_8_ = puVar9[3];
      local_270._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_270.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_270._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_270._M_string_length = puVar9[1];
    *puVar9 = paVar10;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
    goto LAB_00324bbe;
  case VectorStringValue:
    uVar3 = (local_230->comment).index;
    cVar15 = '\x01';
    if (9 < uVar3) {
      uVar13 = uVar3;
      cVar6 = '\x04';
      do {
        cVar15 = cVar6;
        if (uVar13 < 100) {
          cVar15 = cVar15 + -2;
          goto LAB_00324931;
        }
        if (uVar13 < 1000) {
          cVar15 = cVar15 + -1;
          goto LAB_00324931;
        }
        if (uVar13 < 10000) goto LAB_00324931;
        bVar4 = 99999 < uVar13;
        uVar13 = uVar13 / 10000;
        cVar6 = cVar15 + '\x04';
      } while (bVar4);
      cVar15 = cVar15 + '\x01';
    }
LAB_00324931:
    local_250 = &local_240;
    std::__cxx11::string::_M_construct((ulong)&local_250,cVar15);
    std::__detail::__to_chars_10_impl<unsigned_long>(local_250->_M_local_buf,(uint)local_248,uVar3);
    puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,0x388fbf);
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 == paVar10) {
      local_270.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_270.field_2._8_8_ = puVar9[3];
      local_270._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_270.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_270._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_270._M_string_length = puVar9[1];
    *puVar9 = paVar10;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
    goto LAB_00324bbe;
  case VectorUnionValue:
    uVar3 = (local_230->comment).index;
    cVar15 = '\x01';
    if (9 < uVar3) {
      uVar13 = uVar3;
      cVar6 = '\x04';
      do {
        cVar15 = cVar6;
        if (uVar13 < 100) {
          cVar15 = cVar15 + -2;
          goto LAB_00324a7b;
        }
        if (uVar13 < 1000) {
          cVar15 = cVar15 + -1;
          goto LAB_00324a7b;
        }
        if (uVar13 < 10000) goto LAB_00324a7b;
        bVar4 = 99999 < uVar13;
        uVar13 = uVar13 / 10000;
        cVar6 = cVar15 + '\x04';
      } while (bVar4);
      cVar15 = cVar15 + '\x01';
    }
LAB_00324a7b:
    local_250 = &local_240;
    std::__cxx11::string::_M_construct((ulong)&local_250,cVar15);
    std::__detail::__to_chars_10_impl<unsigned_long>(local_250->_M_local_buf,(uint)local_248,uVar3);
    puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,0x388fd1);
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 == paVar10) {
      local_270.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_270.field_2._8_8_ = puVar9[3];
      local_270._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_270.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_270._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_270._M_string_length = puVar9[1];
    *puVar9 = paVar10;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
LAB_00324bbe:
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 == paVar10) {
      local_1d0._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_1d0._8_8_ = puVar9[3];
      local_1e0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_1e0 + 0x10);
    }
    else {
      local_1d0._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_1e0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar9;
    }
    local_1e0._8_8_ = puVar9[1];
    *puVar9 = paVar10;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_228,(string *)local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_1e0 + 0x10)) {
      operator_delete((void *)local_1e0._0_8_,local_1d0._M_allocated_capacity + 1);
    }
    pBVar18 = local_230;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != paVar14) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    uVar16 = local_240._M_allocated_capacity;
    _Var17._M_p = (pointer)local_250;
    if (local_250 != &local_240) {
LAB_00324c61:
      operator_delete(_Var17._M_p,uVar16 + 1);
    }
  default:
    goto switchD_003242f7_default;
  }
  std::__cxx11::string::_M_replace((ulong)&local_228,0,(char *)0x0,(ulong)pcVar12);
switchD_003242f7_default:
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_1e0 + 0x10);
  paVar10 = &local_270.field_2;
  if ((pBVar18->comment).default_value._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                   " ",&(pBVar18->comment).default_value);
    std::__cxx11::string::_M_append((char *)&local_228,local_1e0._0_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._0_8_ != paVar14) {
      operator_delete((void *)local_1e0._0_8_,local_1d0._M_allocated_capacity + 1);
    }
  }
  BVar2 = (pBVar18->comment).status;
  switch(BVar2) {
  case ERROR:
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                   "ERROR: ",&local_228);
LAB_00324d31:
    std::__cxx11::string::operator=((string *)&local_228,(string *)local_1e0);
    local_50.field_2._M_allocated_capacity = local_1d0._M_allocated_capacity;
    local_50._M_dataplus._M_p = (pointer)local_1e0._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._0_8_ == paVar14) goto switchD_00324d16_default;
    goto LAB_00324f7f;
  case ERROR_OFFSET_OUT_OF_BINARY:
    std::operator+(&local_270,"ERROR: ",&local_228);
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
    break;
  case ERROR_INCOMPLETE_BINARY:
    std::operator+(&local_50,"ERROR: ",&local_228);
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 == paVar14) {
      local_240._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_240._8_8_ = puVar9[3];
      local_250 = &local_240;
    }
    else {
      local_240._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_250 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar9;
    }
    local_248 = puVar9[1];
    *puVar9 = paVar14;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_250,(ulong)(pBVar18->comment).status_message._M_dataplus._M_p
                       );
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 == paVar14) {
      local_270.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_270.field_2._8_8_ = puVar9[3];
      local_270._M_dataplus._M_p = (pointer)paVar10;
    }
    else {
      local_270.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_270._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_270._M_string_length = puVar9[1];
    *puVar9 = paVar14;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 == paVar14) {
      local_1d0._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_1d0._8_8_ = puVar9[3];
      local_1e0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_1e0 + 0x10);
    }
    else {
      local_1d0._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_1e0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar9;
    }
    local_1e0._8_8_ = puVar9[1];
    *puVar9 = paVar14;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_228,(string *)local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_1e0 + 0x10)) {
      operator_delete((void *)local_1e0._0_8_,local_1d0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != paVar10) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    if (local_250 != &local_240) {
      operator_delete(local_250,local_240._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_00324f7f;
    goto switchD_00324d16_default;
  case ERROR_LENGTH_TOO_LONG:
    std::operator+(&local_270,"ERROR: ",&local_228);
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
    break;
  case ERROR_LENGTH_TOO_SHORT:
    std::operator+(&local_270,"ERROR: ",&local_228);
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
    break;
  case ERROR_REQUIRED_FIELD_NOT_PRESENT:
    std::operator+(&local_270,"ERROR: ",&local_228);
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
    break;
  case ERROR_INVALID_UNION_TYPE:
    std::operator+(&local_270,"ERROR: ",&local_228);
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
    break;
  case ERROR_CYCLE_DETECTED:
    std::operator+(&local_270,"ERROR: ",&local_228);
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
    break;
  default:
    switch(BVar2) {
    case WARN:
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
                     "WARN: ",&local_228);
      goto LAB_00324d31;
    case WARN_NO_REFERENCES:
      pcVar12 = "WARN: nothing refers to this section.";
      break;
    case WARN_CORRUPTED_PADDING:
      pcVar12 = "WARN: could be corrupted padding region.";
      break;
    case WARN_PADDING_LENGTH:
      pcVar12 = "WARN: padding is longer than expected.";
      break;
    default:
      goto switchD_00324d16_default;
    }
    std::__cxx11::string::_M_replace
              ((ulong)&local_228,0,(char *)local_228._M_string_length,(ulong)pcVar12);
    goto switchD_00324d16_default;
  }
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 == paVar11) {
    local_1d0._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_1d0._8_8_ = puVar9[3];
    local_1e0._0_8_ = paVar14;
  }
  else {
    local_1d0._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_1e0._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*puVar9;
  }
  local_1e0._8_8_ = puVar9[1];
  *puVar9 = paVar11;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_228,(string *)local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._0_8_ != paVar14) {
    operator_delete((void *)local_1e0._0_8_,local_1d0._M_allocated_capacity + 1);
  }
  local_50.field_2._M_allocated_capacity = local_270.field_2._M_allocated_capacity;
  local_50._M_dataplus._M_p = local_270._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != paVar10) {
LAB_00324f7f:
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
switchD_00324d16_default:
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,local_228._M_dataplus._M_p,local_228._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar1) {
    uVar16 = CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                      local_228.field_2._M_local_buf[0]);
    _Var17._M_p = local_228._M_dataplus._M_p;
LAB_00324fa8:
    operator_delete(_Var17._M_p,uVar16 + 1);
  }
  return;
}

Assistant:

static void GenerateDocumentation(std::ostream &os, const BinaryRegion &region,
                                  const BinarySection &section,
                                  const uint8_t *binary,
                                  DocContinuation &continuation,
                                  const OutputConfig &output_config) {
  // Check if there is a doc continuation that should be prioritized.
  if (continuation.value_start_column) {
    os << std::string(continuation.value_start_column - 2, ' ');
    os << output_config.delimiter << " ";

    os << continuation.value.substr(0, output_config.max_bytes_per_line);
    continuation.value = continuation.value.substr(
        std::min(output_config.max_bytes_per_line, continuation.value.size()));
    return;
  }

  size_t size_of = 0;
  {
    std::stringstream ss;
    ss << std::setw(static_cast<int>(output_config.largest_type_string))
       << std::left;
    ss << GenerateTypeString(region);
    os << ss.str();
    size_of = ss.str().size();
  }
  os << " " << output_config.delimiter << " ";
  if (region.array_length) {
    // Record where the value is first being outputted.
    continuation.value_start_column = 3 + size_of;

    // Get the full-length value, which we will chunk below.
    const std::string value = ToValueString(region, binary, output_config);

    std::stringstream ss;
    ss << std::setw(static_cast<int>(output_config.largest_value_string))
       << std::left;
    ss << value.substr(0, output_config.max_bytes_per_line);
    os << ss.str();

    continuation.value =
        value.substr(std::min(output_config.max_bytes_per_line, value.size()));
  } else {
    std::stringstream ss;
    ss << std::setw(static_cast<int>(output_config.largest_value_string))
       << std::left;
    ss << ToValueString(region, binary, output_config);
    os << ss.str();
  }

  os << " " << output_config.delimiter << " ";
  os << GenerateComment(region.comment, section);
}